

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

value_type __thiscall djb::npf::eval(npf *this,vec3 *dirIn,vec3 *dirOut,void *param_3)

{
  float_t *pfVar1;
  initializer_list<float> __l;
  uint uVar2;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *extraout_RDX_01;
  float *extraout_RDX_02;
  float *pfVar3;
  float fVar4;
  float_t fVar5;
  undefined4 extraout_XMM0_Db;
  double dVar6;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  vec3 vVar7;
  value_type vVar8;
  float_t local_2dc;
  float_t local_2d8;
  float_t local_2d4;
  iterator local_2d0;
  undefined8 local_2c8;
  vec3 local_2c0;
  vec3 local_2b0;
  vec3 local_2a0;
  vec3 local_290;
  vec3 local_280;
  vec3 local_270;
  vec3 local_260;
  vec3 local_250;
  vec3 local_240;
  vec3 local_230;
  vec3 local_220;
  vec3 local_210;
  vec3 local_200;
  undefined1 local_1f4 [8];
  vec3 BRDF;
  float_t local_1e0;
  vec3 local_1c8;
  undefined1 local_1b8 [8];
  vec3 F;
  double local_1a0;
  int local_194;
  double dStack_190;
  int iF;
  double tmp2;
  float_t local_180;
  double local_178;
  vec3 G1O;
  float_t fStack_164;
  float_t local_160;
  undefined1 local_158 [8];
  vec3 G1I;
  float_t fStack_144;
  float_t local_140;
  vec3 local_128;
  undefined1 local_118 [8];
  vec3 D;
  double local_100;
  double local_f8;
  uint local_ec;
  float_t fStack_e8;
  int iD;
  float_t local_e0;
  undefined1 local_d4 [8];
  vec3 rhoS;
  float_t local_c0;
  undefined1 local_b8 [8];
  vec3 rhoD;
  vec2 uv;
  float_t local_98;
  float thetaO;
  float_t local_90;
  float thetaI;
  float_t local_88;
  float thetaD;
  float_t fStack_80;
  float thetaH;
  float_t local_78;
  undefined1 local_70 [8];
  vec3 dirH;
  vec3 dirNormal;
  float_t nrm;
  float_t local_48;
  undefined1 local_3c [8];
  vec3 tmp;
  void *param_3_local;
  vec3 *dirOut_local;
  vec3 *dirIn_local;
  npf *this_local;
  
  if ((dirOut->z <= 0.0 && dirOut->z != 0.0) ||
     (*(float *)((long)param_3 + 8) <= 0.0 && *(float *)((long)param_3 + 8) != 0.0)) {
    (**(code **)(*(long *)dirIn + 0x10))(this);
    pfVar3 = extraout_RDX;
  }
  else {
    vVar7 = djb::operator+(dirOut,(vec3 *)param_3);
    stack0xffffffffffffffb0 = vVar7._0_8_;
    local_3c._0_4_ = dirNormal.z;
    local_3c._4_4_ = nrm;
    local_48 = vVar7.z;
    tmp.x = local_48;
    unique0x10000678 = vVar7;
    dirNormal.y = dot((vec3 *)local_3c,(vec3 *)local_3c);
    if ((dirNormal.y != 0.0) || (NAN(dirNormal.y))) {
      pfVar1 = &dirH.z;
      vec3::vec3((vec3 *)pfVar1,0.0,0.0,1.0);
      fVar4 = inversesqrt<float>(&dirNormal.y);
      vVar7 = djb::operator*((vec3 *)local_3c,fVar4);
      local_78 = vVar7.z;
      dirH.x = local_78;
      _fStack_80 = vVar7._0_8_;
      local_70._0_4_ = fStack_80;
      local_70._4_4_ = thetaH;
      _fStack_80 = vVar7;
      local_88 = dot((vec3 *)local_70,(vec3 *)pfVar1);
      fVar4 = sat<float>(&local_88);
      dVar6 = std::acos((double)CONCAT44(extraout_XMM0_Db,fVar4));
      thetaD = SUB84(dVar6,0);
      local_90 = dot(dirOut,(vec3 *)local_70);
      fVar4 = sat<float>(&local_90);
      dVar6 = std::acos((double)CONCAT44(extraout_XMM0_Db_00,fVar4));
      thetaI = SUB84(dVar6,0);
      local_98 = dot(dirOut,(vec3 *)pfVar1);
      fVar4 = sat<float>(&local_98);
      dVar6 = std::acos((double)CONCAT44(extraout_XMM0_Db_01,fVar4));
      thetaO = SUB84(dVar6,0);
      uv.x = dot((vec3 *)param_3,(vec3 *)pfVar1);
      fVar4 = sat<float>(&uv.x);
      dVar6 = std::acos((double)CONCAT44(extraout_XMM0_Db_02,fVar4));
      uv.y = SUB84(dVar6,0);
      pfVar1 = &rhoD.z;
      vec2::vec2((vec2 *)pfVar1,0.0);
      rhoD.z = 0.0;
      vVar7 = uberTextureLookup((npf *)dirIn,(vec2 *)pfVar1);
      local_c0 = vVar7.z;
      rhoD.x = local_c0;
      rhoS._4_8_ = vVar7._0_8_;
      local_b8._0_4_ = rhoS.y;
      local_b8._4_4_ = rhoS.z;
      rhoD.z = 0.001953125;
      unique0x10000660 = vVar7;
      vVar7 = uberTextureLookup((npf *)dirIn,(vec2 *)pfVar1);
      _fStack_e8 = vVar7._0_8_;
      local_d4._0_4_ = fStack_e8;
      local_d4._4_4_ = iD;
      local_e0 = vVar7.z;
      rhoS.x = local_e0;
      _fStack_e8 = vVar7;
      local_f8 = sqrt((((double)thetaD / 3.141592653589793) / 2.0) * 90.0 * 90.0);
      local_100 = 0.0;
      stack0xfffffffffffffef8 = 0x4056400000000000;
      dVar6 = clamp<double>(&local_f8,&local_100,(double *)&D.z);
      local_ec = (uint)dVar6;
      rhoD.z = (float)(int)(local_ec + 2) / 512.0;
      if (((uint)dirIn[3].x & 1) != 0) {
        printf("iD: %i\n",(ulong)local_ec);
      }
      vVar7 = uberTextureLookup((npf *)dirIn,(vec2 *)&rhoD.z);
      local_128.z = vVar7.z;
      D.x = local_128.z;
      local_128._0_8_ = vVar7._0_8_;
      local_118._0_4_ = local_128.x;
      local_118._4_4_ = local_128.y;
      vVar7 = uberTextureLookupInt((npf *)dirIn,local_ec + 2);
      local_140 = vVar7.z;
      stack0xfffffffffffffeb8 = vVar7._0_8_;
      D.x = local_140;
      local_118._0_4_ = G1I.z;
      local_118._4_4_ = fStack_144;
      unique0x10000648 = vVar7;
      vVar7 = lookupInterpolatedG1((npf *)dirIn,(int)dirIn[2].z,thetaO);
      local_160 = vVar7.z;
      G1I.x = local_160;
      stack0xfffffffffffffe98 = vVar7._0_8_;
      local_158._0_4_ = G1O.z;
      local_158._4_4_ = fStack_164;
      unique0x1000063c = vVar7;
      _tmp2 = lookupInterpolatedG1((npf *)dirIn,(int)dirIn[2].z,uv.y);
      G1O.x = local_180;
      local_178 = tmp2;
      dStack_190 = ((double)thetaI / 3.141592653589793) * 0.5 * 90.0;
      local_1a0 = 0.0;
      stack0xfffffffffffffe58 = 0x4056400000000000;
      dVar6 = clamp<double>(&stack0xfffffffffffffe70,&local_1a0,(double *)&F.z);
      local_194 = (int)dVar6;
      rhoD.z = (float)(local_194 + 0xb6) * 0.001953125;
      vVar7 = uberTextureLookup((npf *)dirIn,(vec2 *)&rhoD.z);
      local_1c8.z = vVar7.z;
      F.x = local_1c8.z;
      local_1c8._0_8_ = vVar7._0_8_;
      local_1b8._0_4_ = local_1c8.x;
      local_1b8._4_4_ = local_1c8.y;
      vVar7 = uberTextureLookupInt((npf *)dirIn,local_194 + 0xb6);
      local_1e0 = vVar7.z;
      BRDF._4_8_ = vVar7._0_8_;
      F.x = local_1e0;
      local_1b8._0_4_ = BRDF.y;
      local_1b8._4_4_ = BRDF.z;
      unique0x10000630 = vVar7;
      vVar7 = djb::operator*((vec3 *)local_d4,(vec3 *)local_118);
      local_240.z = vVar7.z;
      local_230.z = local_240.z;
      local_240._0_8_ = vVar7._0_8_;
      local_230.x = local_240.x;
      local_230.y = local_240.y;
      local_240 = vVar7;
      vVar7 = djb::operator*(&local_230,(vec3 *)local_1b8);
      local_250.z = vVar7.z;
      local_220.z = local_250.z;
      local_250._0_8_ = vVar7._0_8_;
      local_220.x = local_250.x;
      local_220.y = local_250.y;
      local_250 = vVar7;
      dVar6 = std::cos((double)(ulong)(uint)thetaO);
      vVar7 = djb::operator/((vec3 *)local_158,SUB84(dVar6,0));
      local_270.z = vVar7.z;
      local_260.z = local_270.z;
      local_270._0_8_ = vVar7._0_8_;
      local_260.x = local_270.x;
      local_260.y = local_270.y;
      local_270 = vVar7;
      vVar7 = djb::operator*(&local_220,&local_260);
      local_280.z = vVar7.z;
      local_210.z = local_280.z;
      local_280._0_8_ = vVar7._0_8_;
      local_210.x = local_280.x;
      local_210.y = local_280.y;
      local_280 = vVar7;
      dVar6 = std::cos((double)(ulong)(uint)uv.y);
      vVar7 = djb::operator/((vec3 *)&local_178,SUB84(dVar6,0));
      local_2a0.z = vVar7.z;
      local_290.z = local_2a0.z;
      local_2a0._0_8_ = vVar7._0_8_;
      local_290.x = local_2a0.x;
      local_290.y = local_2a0.y;
      local_2a0 = vVar7;
      vVar7 = djb::operator*(&local_210,&local_290);
      local_2b0.z = vVar7.z;
      local_200.z = local_2b0.z;
      local_2b0._0_8_ = vVar7._0_8_;
      local_200.x = local_2b0.x;
      local_200.y = local_2b0.y;
      local_2b0 = vVar7;
      vVar7 = djb::operator+((vec3 *)local_b8,&local_200);
      local_2c0._0_8_ = vVar7._0_8_;
      local_1f4._0_4_ = local_2c0.x;
      local_1f4._4_4_ = local_2c0.y;
      local_2c0.z = vVar7.z;
      BRDF.x = local_2c0.z;
      local_2c0 = vVar7;
      operator*=((vec3 *)local_1f4,*(float_t *)((long)param_3 + 8));
      operator*=((vec3 *)local_1f4,0.0625);
      *(undefined1 *)&dirIn[3].x = 0;
      fVar5 = dot((vec3 *)local_1f4,(vec3 *)local_1f4);
      dVar6 = std::fabs((double)CONCAT44(extraout_XMM0_Db_03,fVar5));
      if (SUB84(dVar6,0) <= 10000.0) {
        fVar5 = dot((vec3 *)local_1f4,(vec3 *)local_1f4);
        uVar2 = std::isnan((double)CONCAT44(extraout_XMM0_Db_04,fVar5));
        if ((uVar2 & 1) == 0) {
          local_2dc = (float_t)local_1f4._0_4_;
          local_2d8 = (float_t)local_1f4._4_4_;
          local_2d4 = BRDF.x;
          local_2d0 = &local_2dc;
          local_2c8 = 3;
          __l._M_len = 3;
          __l._M_array = local_2d0;
          std::valarray<float>::valarray((valarray<float> *)this,__l);
          pfVar3 = extraout_RDX_02;
          goto LAB_00169b84;
        }
      }
      (**(code **)(*(long *)dirIn + 0x10))(this);
      pfVar3 = extraout_RDX_01;
    }
    else {
      (**(code **)(*(long *)dirIn + 0x10))(this);
      pfVar3 = extraout_RDX_00;
    }
  }
LAB_00169b84:
  vVar8._M_data = pfVar3;
  vVar8._M_size = (size_t)this;
  return vVar8;
}

Assistant:

brdf::value_type npf::eval(const vec3 &dirIn, const vec3 &dirOut, const void *) const
{
	if (dirIn.z < 0 || dirOut.z < 0)
		return zero_value();

	vec3 tmp = dirIn + dirOut;
	float_t nrm = dot(tmp, tmp);

	if (nrm == 0)
		return zero_value();
	vec3 dirNormal = vec3(0, 0, 1);
	vec3 dirH = tmp * inversesqrt(nrm);
	float thetaH = acos(sat(dot(dirH, dirNormal)));
	float thetaD = acos(sat(dot(dirIn, dirH)));
	float thetaI = acos(sat(dot(dirIn, dirNormal)));
	float thetaO = acos(sat(dot(dirOut, dirNormal)));

	// BRDF texture has a fixed size of 512x256
	vec2 uv;
	uv.y = float(m_id)/256.;

	uv.x = 0.0/512.;
	vec3 rhoD = uberTextureLookup(uv);
	//if (m_first) printf("%f %f %f\n", rhoD.x, rhoD.y, rhoD.z); //OK

	uv.x = 1.0/512.;
	vec3 rhoS = uberTextureLookup(uv);
	//if (m_first) printf("%f %f %f\n", rhoS.x, rhoS.y, rhoS.z); //OK

	int iD = int(clamp(sqrt(thetaH / M_PI / 2
	             * 90.0 * 90.0), 0.0, 89.0));
	uv.x = float(iD+2)/512.;
	if (m_first)
		printf("iD: %i\n", iD);
	vec3 D = uberTextureLookup(uv);
	D = uberTextureLookupInt(iD+2); //OK

	vec3 G1I = lookupInterpolatedG1(m_id, thetaI);

	vec3 G1O = lookupInterpolatedG1(m_id, thetaO);

	auto tmp2 = thetaD / M_PI / 2 * 90.0;
	int iF = int(clamp(tmp2, 0.0, 89.0));
	uv.x = float(iF+2+90+90)/512.;
	vec3 F = uberTextureLookup(uv);
	F = uberTextureLookupInt(iF+2+90+90); //OK

	vec3 BRDF = (rhoD) + (rhoS) * D * F *
	            (G1I / cos(thetaI)) * (G1O / cos(thetaO));
	BRDF*= dirOut.z;
	BRDF*= 1.0 / 16;

	m_first = false;

	if (fabs(dot(BRDF, BRDF)) > 9999.9999f || std::isnan(dot(BRDF, BRDF))) {
		return zero_value();
	}

	return brdf::value_type({BRDF.x, BRDF.y, BRDF.z});
}